

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManBuiltInSimPerformInt(Gia_Man_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  word *pwVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if ((iObj < 0) || (iVar1 = p->nObjs, iVar1 <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar2 = p->nSimWords;
  uVar5 = (ulong)uVar2;
  uVar7 = uVar2 * iObj;
  if (-1 < (int)uVar7) {
    iVar3 = p->vSims->nSize;
    if ((int)uVar7 < iVar3) {
      uVar8 = *(ulong *)(p->pObjs + (uint)iObj);
      uVar9 = (iObj - ((uint)uVar8 & 0x1fffffff)) * uVar2;
      if ((((-1 < (int)uVar9) && ((int)uVar9 < iVar3)) &&
          (uVar6 = (iObj - ((uint)(uVar8 >> 0x20) & 0x1fffffff)) * uVar2, -1 < (int)uVar6)) &&
         ((int)uVar6 < iVar3)) {
        pwVar4 = p->vSims->pArray;
        if ((p->fBuiltInSim == 0) && (p->fIncrSim == 0)) {
          __assert_fail("p->fBuiltInSim || p->fIncrSim",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                        ,0x323,"void Gia_ManBuiltInSimPerformInt(Gia_Man_t *, int)");
        }
        if (((uint)uVar8 >> 0x1d & 1) == 0) {
          if ((uVar8 >> 0x3d & 1) == 0) {
            if (0 < (int)uVar2) {
              uVar8 = 0;
              do {
                pwVar4[uVar7 + uVar8] = pwVar4[uVar6 + uVar8] & pwVar4[uVar9 + uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar5 != uVar8);
            }
          }
          else if (0 < (int)uVar2) {
            uVar8 = 0;
            do {
              pwVar4[uVar7 + uVar8] = ~pwVar4[uVar6 + uVar8] & pwVar4[uVar9 + uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
        }
        else if ((uVar8 >> 0x3d & 1) == 0) {
          if (0 < (int)uVar2) {
            uVar8 = 0;
            do {
              pwVar4[uVar7 + uVar8] = ~pwVar4[uVar9 + uVar8] & pwVar4[uVar6 + uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
        }
        else if (0 < (int)uVar2) {
          uVar8 = 0;
          do {
            pwVar4[uVar7 + uVar8] = ~(pwVar4[uVar6 + uVar8] | pwVar4[uVar9 + uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        if (iVar3 != uVar2 * iVar1) {
          __assert_fail("Vec_WrdSize(p->vSims) == Gia_ManObjNum(p) * p->nSimWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                        ,0x336,"void Gia_ManBuiltInSimPerformInt(Gia_Man_t *, int)");
        }
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Gia_ManBuiltInSimPerformInt( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj ); int w;
    word * pInfo  = Gia_ManBuiltInData( p, iObj ); 
    word * pInfo0 = Gia_ManBuiltInData( p, Gia_ObjFaninId0(pObj, iObj) );
    word * pInfo1 = Gia_ManBuiltInData( p, Gia_ObjFaninId1(pObj, iObj) ); 
    assert( p->fBuiltInSim || p->fIncrSim );
    if ( Gia_ObjFaninC0(pObj) )
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
        else 
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = ~pInfo0[w] & pInfo1[w];
    }
    else 
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = pInfo0[w] & ~pInfo1[w];
        else 
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = pInfo0[w] & pInfo1[w];
    }
    assert( Vec_WrdSize(p->vSims) == Gia_ManObjNum(p) * p->nSimWords );
}